

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

int dodrop(obj *obj)

{
  int iVar1;
  obj *poVar2;
  obj *ostack;
  obj *local_20;
  
  poVar2 = invent;
  local_20 = (obj *)0x0;
  if (u.ushops[0] != '\0') {
    sellobj_state(1);
  }
  if (obj == (obj *)0x0) {
    obj = getobj("\x13\x14" + (ulong)(poVar2 == (obj *)0x0) * 2,"drop",&local_20);
    poVar2 = local_20;
  }
  else {
    poVar2 = (obj *)0x0;
  }
  iVar1 = drop(obj,poVar2);
  if (u.ushops[0] != '\0') {
    sellobj_state(0);
  }
  reset_occupations();
  return iVar1;
}

Assistant:

int dodrop(struct obj *obj)
{
	struct obj *ostack = NULL;
	int result, i = (invent) ? 0 : (SIZE(drop_types) - 1);

	if (*u.ushops) sellobj_state(SELL_DELIBERATE);
	if (!obj) obj = getobj(&drop_types[i], "drop", &ostack);
	result = drop(obj, ostack);
	if (*u.ushops) sellobj_state(SELL_NORMAL);
	reset_occupations();

	return result;
}